

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Gia_ManDumpTestsSimulate(Gia_Man_t *p,Vec_Int_t *vValues)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  if (vValues->nSize != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vValues) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                  ,0x2ea,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar4];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0051abcc;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vValues->nSize <= lVar4) goto LAB_0051abeb;
      pGVar2 = p->pObjs + iVar9;
      *(ulong *)pGVar2 =
           *(ulong *)pGVar2 & 0xffffffffbfffffff | (ulong)((vValues->pArray[lVar4] & 1U) << 0x1e);
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  iVar9 = p->nObjs;
  if (0 < iVar9) {
    lVar4 = 0;
    lVar8 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar4);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        *(ulong *)(&pGVar2->field_0x0 + lVar4) =
             uVar3 & 0xffffffff3fffffff |
             (ulong)((((uint)(uVar3 >> 0x3d) ^
                      *(uint *)((long)pGVar2 +
                               (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + lVar4) >> 0x1e) &
                      ((uint)(uVar3 >> 0x1d) & 7 ^
                      *(uint *)((long)pGVar2 +
                               (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3 + lVar4) >> 0x1e)
                     & 1) << 0x1e);
        iVar9 = p->nObjs;
      }
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar8 < iVar9);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar4];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0051abcc;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar9;
      uVar6 = (uint)*(ulong *)pGVar2;
      *(ulong *)pGVar2 =
           *(ulong *)pGVar2 & 0xffffffffbfffffff |
           (ulong)((uVar6 * 2 ^ *(uint *)(pGVar2 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  vValues->nSize = 0;
  iVar9 = p->nRegs;
  if (iVar9 < 1) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar6 = (iVar1 - iVar9) + iVar7;
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
LAB_0051abeb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0051abcc:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(vValues,*(uint *)(p->pObjs + iVar1) >> 0x1e & 1);
      iVar7 = iVar7 + 1;
      iVar9 = p->nRegs;
    } while (iVar7 < iVar9);
    iVar7 = vValues->nSize;
  }
  if (iVar7 == iVar9) {
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                ,0x2f7,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManDumpTestsSimulate( Gia_Man_t * p, Vec_Int_t * vValues )
{
    Gia_Obj_t * pObj; int k;
    assert( Vec_IntSize(vValues) == Gia_ManCiNum(p) );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachCi( p, pObj, k )
        pObj->fMark0 = Vec_IntEntry( vValues, k );
    Gia_ManForEachAnd( p, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    Gia_ManForEachCo( p, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // collect flop input values
    Vec_IntClear( vValues );
    Gia_ManForEachRi( p, pObj, k )
        Vec_IntPush( vValues, pObj->fMark0 );
    assert( Vec_IntSize(vValues) == Gia_ManRegNum(p) );
}